

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.cpp
# Opt level: O2

bool vera::loadOBJ(string *_filename,Scene *_scene,bool _verbose)

{
  int iVar1;
  pointer paVar2;
  pointer piVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  bool bVar6;
  ostream *poVar7;
  ulong uVar8;
  _Rb_tree_header *p_Var9;
  iterator iVar10;
  Material *pMVar11;
  mapped_type *ppMVar12;
  iterator iVar13;
  mapped_type *pmVar14;
  iterator iVar15;
  mapped_type *_normal;
  size_t m;
  pointer paVar16;
  uint32_t _i;
  long lVar17;
  int mCounter;
  int local_340;
  int local_33c;
  MaterialsMap *local_338;
  ulong local_330;
  int local_324;
  Scene *local_320;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> materials;
  string meshName;
  vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> shapes;
  Material *local_2b8;
  int vi;
  map<int,_tinyobj::index_t,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
  unique_indices;
  map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
  smoothVertexNormals;
  string name;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string err;
  string warn;
  string base_dir;
  attrib_t attrib;
  Mesh mesh;
  
  local_320 = _scene;
  memset(&attrib,0,0x90);
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  warn._M_dataplus._M_p = (pointer)&warn.field_2;
  warn._M_string_length = 0;
  warn.field_2._M_local_buf[0] = '\0';
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  err.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string
            ((string *)&mesh,(_filename->_M_dataplus)._M_p,(allocator *)&smoothVertexNormals);
  getBaseDir(&base_dir,(string *)&mesh);
  std::__cxx11::string::~string((string *)&mesh);
  bVar5 = tinyobj::LoadObj(&attrib,&shapes,&materials,&warn,&err,(_filename->_M_dataplus)._M_p,
                           base_dir._M_dataplus._M_p,true,true);
  if (warn._M_string_length != 0) {
    poVar7 = std::operator<<((ostream *)&std::cout,"WARN: ");
    poVar7 = std::operator<<(poVar7,(string *)&warn);
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  if (err._M_string_length != 0) {
    poVar7 = std::operator<<((ostream *)&std::cerr,(string *)&err);
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  if (bVar5) {
    if (_verbose) {
      poVar7 = std::operator<<((ostream *)&std::cerr,"Loading ");
      poVar7 = std::operator<<(poVar7,(_filename->_M_dataplus)._M_p);
      std::endl<char,std::char_traits<char>>(poVar7);
      uVar8 = (ulong)((long)attrib.vertices.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_start) >> 2;
      uVar8 = (ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff;
      printf("    Total vertices  = %d\n",(long)uVar8 / 3 & 0xffffffff,(long)uVar8 % 3 & 0xffffffff)
      ;
      uVar8 = (ulong)((long)attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)attrib.colors.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2;
      uVar8 = (ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff;
      printf("    Total colors    = %d\n",(long)uVar8 / 3 & 0xffffffff,(long)uVar8 % 3 & 0xffffffff)
      ;
      uVar8 = (ulong)((long)attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl
                            .super__Vector_impl_data._M_finish -
                     (long)attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2;
      uVar8 = (ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff;
      printf("    Total normals   = %d\n",(long)uVar8 / 3 & 0xffffffff,(long)uVar8 % 3 & 0xffffffff)
      ;
      uVar8 = (ulong)((long)attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 2;
      uVar8 = (ulong)(uint)((int)uVar8 >> 0x1f) << 0x20 | uVar8 & 0xffffffff;
      printf("    Total texcoords = %d\n",(long)uVar8 / 2 & 0xffffffff,(long)uVar8 % 2 & 0xffffffff)
      ;
      printf("    Total materials = %d\n",
             ((long)materials.
                    super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)materials.
                   super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x748 & 0xffffffff,
             ((long)materials.
                    super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)materials.
                   super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
                   _M_impl.super__Vector_impl_data._M_start) % 0x748);
      printf("    Total shapes    = %d\n",
             ((long)shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0xe0 & 0xffffffff,
             ((long)shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                   _M_impl.super__Vector_impl_data._M_start) % 0xe0);
      poVar7 = std::operator<<((ostream *)&std::cerr,"Shapes: ");
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    local_338 = &local_320->materials;
    p_Var9 = &(local_320->materials)._M_t._M_impl.super__Rb_tree_header;
    lVar17 = 0;
    for (uVar8 = 0;
        uVar8 < (ulong)(((long)materials.
                               super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)materials.
                              super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x748); uVar8 = uVar8 + 1
        ) {
      iVar10 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
               ::find(&local_338->_M_t,
                      (key_type *)
                      ((long)(materials.
                              super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                              ._M_impl.super__Vector_impl_data._M_start)->ambient + lVar17 + -0x20))
      ;
      if ((_Rb_tree_header *)iVar10._M_node == p_Var9) {
        if (_verbose) {
          poVar7 = std::operator<<((ostream *)&std::cout,"Add Material ");
          poVar7 = std::operator<<(poVar7,(string *)
                                          ((long)(materials.
                                                  super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 ambient + lVar17 + -0x20));
          std::endl<char,std::char_traits<char>>(poVar7);
        }
        pMVar11 = InitMaterial((material_t *)
                               ((long)(materials.
                                       super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->ambient +
                               lVar17 + -0x20),local_320,&base_dir);
        ppMVar12 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
                   ::operator[](local_338,
                                (key_type *)
                                ((long)(materials.
                                        super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->ambient +
                                lVar17 + -0x20));
        *ppMVar12 = pMVar11;
      }
      lVar17 = lVar17 + 0x748;
    }
    local_330 = 0;
    while( true ) {
      if ((ulong)(((long)shapes.
                         super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)shapes.
                        super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0xe0) <= local_330) break;
      std::__cxx11::string::string
                ((string *)&name,
                 (string *)
                 (shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                  _M_impl.super__Vector_impl_data._M_start + local_330));
      if (name._M_string_length == 0) {
        toString<unsigned_long>((string *)&mesh,&local_330);
        std::__cxx11::string::operator=((string *)&name,(string *)&mesh);
        std::__cxx11::string::~string((string *)&mesh);
      }
      if (_verbose) {
        poVar7 = std::operator<<((ostream *)&std::cerr,(string *)&name);
        std::endl<char,std::char_traits<char>>(poVar7);
      }
      paVar16 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar8 = local_330;
      smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_header;
      smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      bVar6 = hasSmoothingGroup(shapes.
                                super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>
                                ._M_impl.super__Vector_impl_data._M_start + local_330);
      if (bVar6) {
        if (_verbose) {
          poVar7 = std::operator<<((ostream *)&std::cout,"    . Compute smoothingNormal");
          std::endl<char,std::char_traits<char>>(poVar7);
          paVar16 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar8 = local_330;
        }
        computeSmoothingNormals(&attrib,paVar16 + uVar8,&smoothVertexNormals);
      }
      Mesh::Mesh(&mesh);
      mesh.m_drawMode = TRIANGLES;
      std::__cxx11::string::string((string *)&unique_indices,"default",(allocator *)&meshName);
      iVar10 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
               ::find(&local_338->_M_t,(key_type *)&unique_indices);
      std::__cxx11::string::~string((string *)&unique_indices);
      if ((_Rb_tree_header *)iVar10._M_node == p_Var9) {
        pMVar11 = (Material *)operator_new(0x150);
        std::__cxx11::string::string((string *)&unique_indices,"default",(allocator *)&local_1e8);
        Material::Material(pMVar11,(key_type *)&unique_indices);
        std::__cxx11::string::string((string *)&meshName,"default",(allocator *)&local_208);
        ppMVar12 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
                   ::operator[](local_338,&meshName);
        *ppMVar12 = pMVar11;
        std::__cxx11::string::~string((string *)&meshName);
        std::__cxx11::string::~string((string *)&unique_indices);
      }
      std::__cxx11::string::string((string *)&unique_indices,"default",(allocator *)&meshName);
      ppMVar12 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
                 ::operator[](local_338,(key_type *)&unique_indices);
      local_2b8 = *ppMVar12;
      std::__cxx11::string::~string((string *)&unique_indices);
      unique_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      unique_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      unique_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &unique_indices._M_t._M_impl.super__Rb_tree_header._M_header;
      unique_indices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      mCounter = 0;
      uVar8 = 0;
      lVar17 = 8;
      _i = 0;
      local_324 = -1;
      unique_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           unique_indices._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while( true ) {
        paVar2 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                 _M_impl.super__Vector_impl_data._M_start[local_330].mesh.indices.
                 super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)(((long)shapes.
                           super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                           _M_impl.super__Vector_impl_data._M_start[local_330].mesh.indices.
                           super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)paVar2) / 0xc) <= uVar8
           ) break;
        vi = *(int *)((long)paVar2 + lVar17 + -8);
        local_33c = *(int *)((long)paVar2 + lVar17 + -4);
        local_340 = *(int *)((long)&paVar2->vertex_index + lVar17);
        piVar3 = shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                 _M_impl.super__Vector_impl_data._M_start[local_330].mesh.material_ids.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        if ((shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
             super__Vector_impl_data._M_start[local_330].mesh.material_ids.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
             != piVar3) && (iVar1 = piVar3[(int)(uVar8 / 3)], local_324 != iVar1)) {
          if ((local_324 != -1) &&
             (mesh.m_vertices.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              mesh.m_vertices.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start)) {
            std::operator+(&local_1e8,&name,"_");
            toString<int>(&local_208,&mCounter,3,'0');
            std::operator+(&meshName,&local_1e8,&local_208);
            addModel(local_320,&meshName,&mesh,local_2b8,_verbose);
            std::__cxx11::string::~string((string *)&meshName);
            std::__cxx11::string::~string((string *)&local_208);
            std::__cxx11::string::~string((string *)&local_1e8);
            mCounter = mCounter + 1;
            Mesh::clear(&mesh);
            std::
            _Rb_tree<int,_std::pair<const_int,_tinyobj::index_t>,_std::_Select1st<std::pair<const_int,_tinyobj::index_t>_>,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
            ::clear(&unique_indices._M_t);
            _i = 0;
          }
          ppMVar12 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Material_*>_>_>
                     ::operator[](local_338,
                                  &materials.
                                   super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                   ._M_impl.super__Vector_impl_data._M_start[iVar1].name);
          local_2b8 = *ppMVar12;
          local_324 = iVar1;
        }
        iVar13 = std::
                 _Rb_tree<int,_std::pair<const_int,_tinyobj::index_t>,_std::_Select1st<std::pair<const_int,_tinyobj::index_t>_>,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
                 ::find(&unique_indices._M_t,&vi);
        if ((((_Rb_tree_header *)iVar13._M_node ==
              &unique_indices._M_t._M_impl.super__Rb_tree_header) ||
            (*(int *)&iVar13._M_node[1]._M_parent != local_33c)) ||
           (*(int *)((long)&iVar13._M_node[1]._M_parent + 4) != local_340)) {
          pmVar14 = std::
                    map<int,_tinyobj::index_t,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
                    ::operator[]((map<int,_tinyobj::index_t,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
                                  *)&unique_indices._M_t,&vi);
          pmVar14->vertex_index = _i;
          pmVar14 = std::
                    map<int,_tinyobj::index_t,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
                    ::operator[]((map<int,_tinyobj::index_t,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
                                  *)&unique_indices._M_t,&vi);
          pmVar14->normal_index = local_33c;
          pmVar14 = std::
                    map<int,_tinyobj::index_t,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
                    ::operator[]((map<int,_tinyobj::index_t,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
                                  *)&unique_indices._M_t,&vi);
          pmVar14->texcoord_index = local_340;
          meshName._M_string_length._0_4_ =
               attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[(long)vi * 3 + 2];
          meshName._M_dataplus._M_p =
               *(pointer *)
                (attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + (long)vi * 3);
          Mesh::addVertex(&mesh,(vec3 *)&meshName);
          meshName._0_16_ = getColor(&attrib,vi);
          Mesh::addColor(&mesh,(vec4 *)&meshName);
          if (attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start) {
            if ((smoothVertexNormals._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
               (iVar15 = std::
                         _Rb_tree<int,_std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>,_std::_Select1st<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                         ::find(&smoothVertexNormals._M_t,&vi),
               (_Rb_tree_header *)iVar15._M_node !=
               &smoothVertexNormals._M_t._M_impl.super__Rb_tree_header)) {
              _normal = std::
                        map<int,_glm::vec<3,_float,_(glm::qualifier)0>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
                        ::at(&smoothVertexNormals,&vi);
              Mesh::addNormal(&mesh,_normal);
            }
          }
          else {
            meshName._M_string_length._0_4_ =
                 attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)local_33c * 3 + 2];
            meshName._M_dataplus._M_p =
                 *(pointer *)
                  (attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + (long)local_33c * 3);
            Mesh::addNormal(&mesh,(vec3 *)&meshName);
          }
          auVar4 = (undefined1  [16])meshName._0_16_;
          if (attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start) {
            meshName._M_dataplus._M_p._4_4_ =
                 1.0 - attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[local_340 * 2 + 1];
            meshName._M_dataplus._M_p._0_4_ =
                 attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)local_340 * 2];
            meshName._M_string_length = auVar4._8_8_;
            Mesh::addTexCoord(&mesh,(vec2 *)&meshName);
          }
          Mesh::addIndex(&mesh,_i);
          _i = _i + 1;
        }
        else {
          Mesh::addIndex(&mesh,*(uint32_t *)&iVar13._M_node[1].field_0x4);
        }
        uVar8 = uVar8 + 1;
        lVar17 = lVar17 + 0xc;
      }
      std::__cxx11::string::string((string *)&meshName,(string *)&name);
      if (0 < mCounter) {
        std::operator+(&local_208,&name,"_");
        toString<int>((string *)&vi,&mCounter,3,'0');
        std::operator+(&local_1e8,&local_208,(string *)&vi);
        std::__cxx11::string::operator=((string *)&meshName,(string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)&vi);
        std::__cxx11::string::~string((string *)&local_208);
      }
      addModel(local_320,&meshName,&mesh,local_2b8,_verbose);
      std::__cxx11::string::~string((string *)&meshName);
      std::
      _Rb_tree<int,_std::pair<const_int,_tinyobj::index_t>,_std::_Select1st<std::pair<const_int,_tinyobj::index_t>_>,_std::less<int>,_std::allocator<std::pair<const_int,_tinyobj::index_t>_>_>
      ::~_Rb_tree(&unique_indices._M_t);
      Mesh::~Mesh(&mesh);
      std::
      _Rb_tree<int,_std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>,_std::_Select1st<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_glm::vec<3,_float,_(glm::qualifier)0>_>_>_>
      ::~_Rb_tree(&smoothVertexNormals._M_t);
      std::__cxx11::string::~string((string *)&name);
      local_330 = local_330 + 1;
    }
  }
  else {
    poVar7 = std::operator<<((ostream *)&std::cerr,"Failed to load ");
    poVar7 = std::operator<<(poVar7,(_filename->_M_dataplus)._M_p);
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  std::__cxx11::string::~string((string *)&base_dir);
  std::__cxx11::string::~string((string *)&err);
  std::__cxx11::string::~string((string *)&warn);
  std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::~vector(&materials);
  std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::~vector(&shapes);
  tinyobj::attrib_t::~attrib_t(&attrib);
  return bVar5;
}

Assistant:

bool loadOBJ(const std::string& _filename, Scene* _scene, bool _verbose) {
    tinyobj::attrib_t attrib;
    std::vector<tinyobj::shape_t> shapes;
    std::vector<tinyobj::material_t> materials;

    std::string warn;
    std::string err;
    std::string base_dir = getBaseDir(_filename.c_str());
    bool ret = tinyobj::LoadObj(&attrib, &shapes, &materials, &warn, &err, _filename.c_str(), base_dir.c_str());

    if (!warn.empty()) {
        std::cout << "WARN: " << warn << std::endl;
    }
    if (!err.empty()) {
        std::cerr << err << std::endl;
    }
    if (!ret) {
        std::cerr << "Failed to load " << _filename.c_str() << std::endl;
        return false;
    }

    // Append `default` material
    // materials.push_back(tinyobj::material_t());

    if (_verbose) {
        std::cerr << "Loading " << _filename.c_str() << std::endl;
        printf("    Total vertices  = %d\n", (int)(attrib.vertices.size()) / 3);
        printf("    Total colors    = %d\n", (int)(attrib.colors.size()) / 3);
        printf("    Total normals   = %d\n", (int)(attrib.normals.size()) / 3);
        printf("    Total texcoords = %d\n", (int)(attrib.texcoords.size()) / 2);
        printf("    Total materials = %d\n", (int)materials.size());
        printf("    Total shapes    = %d\n", (int)shapes.size());

        std::cerr << "Shapes: " << std::endl;
    }

    for (size_t m = 0; m < materials.size(); m++) {
        if ( _scene->materials.find( materials[m].name ) == _scene->materials.end() ) {
            if (_verbose)
                std::cout << "Add Material " << materials[m].name << std::endl;

            _scene->materials[ materials[m].name ] = InitMaterial( materials[m], _scene, base_dir );
        }
    }

    for (size_t s = 0; s < shapes.size(); s++) {
        std::string name = shapes[s].name;
        if (name.empty())
            name = toString(s);

        if (_verbose)
            std::cerr << name << std::endl;

        // Check for smoothing group and compute smoothing normals
        std::map<int, glm::vec3> smoothVertexNormals;
        if (hasSmoothingGroup(shapes[s]) > 0) {
            if (_verbose)
                std::cout << "    . Compute smoothingNormal" << std::endl;
            computeSmoothingNormals(attrib, shapes[s], smoothVertexNormals);
        }

        Mesh mesh;
        mesh.setDrawMode(TRIANGLES);

        if (_scene->materials.find("default") == _scene->materials.end())
            _scene->materials["default"] = new Material("default");
        
        Material* mat = _scene->materials["default"];

        std::map<int, tinyobj::index_t> unique_indices;
        std::map<int, tinyobj::index_t>::iterator iter;
        
        int mi = -1;
        int mCounter = 0;
        INDEX_TYPE iCounter = 0;
        for (size_t i = 0; i < shapes[s].mesh.indices.size(); i++) {
            int f = (int)floor(i/3);

            tinyobj::index_t index = shapes[s].mesh.indices[i];
            int vi = index.vertex_index;
            int ni = index.normal_index;
            int ti = index.texcoord_index;

            // Associate w material
            if (shapes[s].mesh.material_ids.size() > 0) {
                int material_index = shapes[s].mesh.material_ids[f];
                if (mi != material_index) {

                    // If there is a switch of material start a new mesh
                    if (mi != -1 && mesh.getVertices().size() > 0) {

                        // std::cout << "Adding model " << name  << "_" << toString(mCounter, 3, '0') << " w new material " << mat.name << std::endl;
                        
                        // Add the model to the stack 
                        addModel(_scene, name + "_"+ toString(mCounter,3,'0'), mesh, mat, _verbose);
                        mCounter++;

                        // Restart the mesh
                        iCounter = 0;
                        mesh.clear();
                        unique_indices.clear();
                    }

                    // assign the current material
                    mi = material_index;
                    mat = _scene->materials[ materials[material_index].name ];
                }
            }

            bool reuse = false;
            iter = unique_indices.find(vi);

                        // if already exist 
            if (iter != unique_indices.end())
                // and have the same attributes
                if ((iter->second.normal_index == ni) &&
                    (iter->second.texcoord_index == ti) )
                    reuse = true;
            
            // Re use the vertex
            if (reuse)
                mesh.addIndex( (INDEX_TYPE)iter->second.vertex_index );
            // Other wise create a new one
            else {
                unique_indices[vi].vertex_index = (int)iCounter;
                unique_indices[vi].normal_index = ni;
                unique_indices[vi].texcoord_index = ti;
                
                mesh.addVertex( getVertex(attrib, vi) );
                mesh.addColor( getColor(attrib, vi) );

                // If there is normals add them
                if (attrib.normals.size() > 0)
                    mesh.addNormal( getNormal(attrib, ni) );

                else if (smoothVertexNormals.size() > 0)
                    if ( smoothVertexNormals.find(vi) != smoothVertexNormals.end() )
                        mesh.addNormal( smoothVertexNormals.at(vi) );

                // If there is texcoords add them
                if (attrib.texcoords.size() > 0)
                    mesh.addTexCoord( getTexCoords(attrib, ti) );

                mesh.addIndex( iCounter++ );
            }
        }

        std::string meshName = name;
        if (mCounter > 0)
            meshName = name + "_" + toString(mCounter, 3, '0');

        // std::cout << "Adding model " << meshName << " w material " << mat.name << std::endl;
        addModel(_scene, meshName, mesh, mat, _verbose);
    }

    return true;
}